

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O0

void __thiscall gvr::ColoredMesh::loadPLY(ColoredMesh *this,PLYReader *ply)

{
  bool bVar1;
  bool bVar2;
  ply_type pVar3;
  long lVar4;
  ulong uVar5;
  string *in_RSI;
  ColoredMesh *in_RDI;
  TriangleReceiver tr;
  int tn;
  UInt8Receiver cb;
  UInt8Receiver cg;
  UInt8Receiver cr;
  ply_type type;
  float scale;
  FloatArrayReceiver nz;
  FloatArrayReceiver ny;
  FloatArrayReceiver nx;
  FloatArrayReceiver sz;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver sc;
  FloatArrayReceiver se;
  FloatArrayReceiver ss;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  FloatArrayReceiver vx;
  int vn;
  undefined4 in_stack_ffffffffffffee98;
  uint uVar6;
  undefined4 in_stack_ffffffffffffee9c;
  Mesh *in_stack_ffffffffffffeea0;
  PLYReader *in_stack_ffffffffffffeea8;
  PLYReader *in_stack_ffffffffffffeeb0;
  allocator *paVar7;
  undefined4 in_stack_ffffffffffffeeb8;
  undefined4 in_stack_ffffffffffffeebc;
  bool local_1125;
  Mesh *this_00;
  PLYReader *in_stack_fffffffffffff0d8;
  Model *in_stack_fffffffffffff0e0;
  bool local_e0d;
  bool local_da5;
  undefined1 local_d59 [38];
  byte local_d33;
  byte local_d32;
  allocator local_d31;
  string local_d30 [37];
  byte local_d0b;
  byte local_d0a;
  allocator local_d09;
  string local_d08 [37];
  byte local_ce3;
  byte local_ce2;
  allocator local_ce1;
  string local_ce0 [39];
  allocator local_cb9;
  string local_cb8 [39];
  undefined1 local_c91 [40];
  allocator local_c69;
  string local_c68 [39];
  allocator local_c41;
  string local_c40 [39];
  allocator local_c19;
  string local_c18 [39];
  allocator local_bf1;
  string local_bf0 [55];
  allocator local_bb9;
  string local_bb8 [32];
  undefined4 local_b98;
  allocator local_b91;
  string local_b90 [39];
  allocator local_b69;
  string local_b68 [39];
  allocator local_b41;
  string local_b40 [39];
  allocator local_b19;
  string local_b18 [39];
  allocator local_af1;
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [39];
  allocator local_aa1;
  string local_aa0 [39];
  allocator local_a79;
  string local_a78 [39];
  allocator local_a51;
  string local_a50 [39];
  allocator local_a29;
  string local_a28 [39];
  allocator local_a01;
  string local_a00 [39];
  allocator local_9d9;
  string local_9d8 [39];
  allocator local_9b1;
  string local_9b0 [39];
  allocator local_989;
  string local_988 [39];
  allocator local_961;
  string local_960 [39];
  allocator local_939;
  string local_938 [39];
  allocator local_911;
  string local_910 [39];
  allocator local_8e9;
  string local_8e8 [135];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [39];
  allocator local_811;
  string local_810 [39];
  allocator local_7e9;
  string local_7e8 [39];
  allocator local_7c1;
  string local_7c0 [39];
  allocator local_799;
  string local_798 [36];
  ply_type local_774;
  undefined4 local_770;
  allocator local_769;
  string local_768 [39];
  allocator local_741;
  string local_740 [39];
  allocator local_719;
  string local_718 [39];
  allocator local_6f1;
  string local_6f0 [39];
  allocator local_6c9;
  string local_6c8 [39];
  allocator local_6a1;
  string local_6a0 [135];
  allocator local_619;
  string local_618 [39];
  allocator local_5f1;
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [39];
  allocator local_551;
  string local_550 [135];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [135];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [133];
  byte local_22b;
  byte local_22a;
  allocator local_229;
  string local_228 [37];
  byte local_203;
  byte local_202;
  allocator local_201;
  string local_200 [37];
  byte local_1db;
  byte local_1da;
  allocator local_1d9;
  string local_1d8 [37];
  byte local_1b3;
  byte local_1b2;
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [37];
  byte local_13b;
  byte local_13a;
  allocator local_139;
  string local_138 [37];
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110 [37];
  byte local_eb;
  byte local_ea;
  allocator local_e9;
  string local_e8 [37];
  byte local_c3;
  byte local_c2;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  uint local_14;
  string *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"vertex",&local_39);
  lVar4 = PLYReader::instancesOfElement
                    (in_stack_ffffffffffffeea8,(string *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_14 = (uint)lVar4;
  Model::setOriginFromPLY(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
  uVar6 = local_14;
  std::allocator<char>::allocator();
  local_c2 = 0;
  local_c3 = 0;
  local_ea = 0;
  local_eb = 0;
  local_112 = 0;
  local_113 = 0;
  local_13a = 0;
  local_13b = 0;
  std::__cxx11::string::string(local_70,"vertex",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"scan_size",&local_99);
  pVar3 = PLYReader::getTypeOfProperty
                    ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                     &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename);
  local_da5 = true;
  if (pVar3 == ply_none) {
    std::allocator<char>::allocator();
    local_c2 = 1;
    std::__cxx11::string::string(local_c0,"vertex",&local_c1);
    local_c3 = 1;
    std::allocator<char>::allocator();
    local_ea = 1;
    std::__cxx11::string::string(local_e8,"scan_error",&local_e9);
    local_eb = 1;
    pVar3 = PLYReader::getTypeOfProperty
                      ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                       &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename);
    local_da5 = true;
    if (pVar3 == ply_none) {
      std::allocator<char>::allocator();
      local_112 = 1;
      std::__cxx11::string::string(local_110,"vertex",&local_111);
      local_113 = 1;
      std::allocator<char>::allocator();
      local_13a = 1;
      std::__cxx11::string::string(local_138,"scan_conf",&local_139);
      local_13b = 1;
      pVar3 = PLYReader::getTypeOfProperty
                        ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                         &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename);
      local_da5 = pVar3 != ply_none;
    }
  }
  std::allocator<char>::allocator();
  local_1b2 = 0;
  local_1b3 = 0;
  local_1da = 0;
  local_1db = 0;
  local_202 = 0;
  local_203 = 0;
  local_22a = 0;
  local_22b = 0;
  std::__cxx11::string::string(local_160,"vertex",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"sx",&local_189);
  pVar3 = PLYReader::getTypeOfProperty
                    ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                     &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename);
  local_e0d = false;
  if (pVar3 != ply_none) {
    std::allocator<char>::allocator();
    local_1b2 = 1;
    std::__cxx11::string::string(local_1b0,"vertex",&local_1b1);
    local_1b3 = 1;
    std::allocator<char>::allocator();
    local_1da = 1;
    std::__cxx11::string::string(local_1d8,"sy",&local_1d9);
    local_1db = 1;
    pVar3 = PLYReader::getTypeOfProperty
                      ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                       &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename);
    local_e0d = false;
    if (pVar3 != ply_none) {
      std::allocator<char>::allocator();
      local_202 = 1;
      std::__cxx11::string::string(local_200,"vertex",&local_201);
      local_203 = 1;
      std::allocator<char>::allocator();
      local_22a = 1;
      std::__cxx11::string::string(local_228,"sz",&local_229);
      local_22b = 1;
      pVar3 = PLYReader::getTypeOfProperty
                        ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                         &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename);
      local_e0d = pVar3 != ply_none;
    }
  }
  (*(in_RDI->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])
            (in_RDI,(ulong)uVar6,(ulong)local_da5,(ulong)local_e0d);
  if ((local_22b & 1) != 0) {
    std::__cxx11::string::~string(local_228);
  }
  if ((local_22a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
  }
  if ((local_203 & 1) != 0) {
    std::__cxx11::string::~string(local_200);
  }
  if ((local_202 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  if ((local_1db & 1) != 0) {
    std::__cxx11::string::~string(local_1d8);
  }
  if ((local_1da & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  if ((local_1b3 & 1) != 0) {
    std::__cxx11::string::~string(local_1b0);
  }
  if ((local_1b2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  if ((local_13b & 1) != 0) {
    std::__cxx11::string::~string(local_138);
  }
  if ((local_13a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  if ((local_113 & 1) != 0) {
    std::__cxx11::string::~string(local_110);
  }
  if ((local_112 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  if ((local_eb & 1) != 0) {
    std::__cxx11::string::~string(local_e8);
  }
  if ((local_ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  if ((local_c3 & 1) != 0) {
    std::__cxx11::string::~string(local_c0);
  }
  if ((local_c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  PointCloud::getVertexArray((PointCloud *)in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  PointCloud::getVertexArray((PointCloud *)in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  PointCloud::getVertexArray((PointCloud *)in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"vertex",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"x",&local_2d9);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"vertex",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"y",&local_329);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"vertex",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"z",&local_379);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  PointCloud::getScanPropArray((PointCloud *)in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  PointCloud::getScanPropArray((PointCloud *)in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  PointCloud::getScanPropArray((PointCloud *)in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  bVar2 = PointCloud::hasScanProp((PointCloud *)in_RDI);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"vertex",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_428,"scan_size",&local_429);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
               &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
               (PLYReceiver *)in_stack_ffffffffffffeea0);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_450,"vertex",&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"scan_error",&local_479);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
               &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
               (PLYReceiver *)in_stack_ffffffffffffeea0);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"vertex",&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"scan_conf",&local_4c9);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
               &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
               (PLYReceiver *)in_stack_ffffffffffffeea0);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  }
  PointCloud::getScanPosArray((PointCloud *)in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  PointCloud::getScanPosArray((PointCloud *)in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  PointCloud::getScanPosArray((PointCloud *)in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  bVar2 = PointCloud::hasScanPos((PointCloud *)in_RDI);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"vertex",&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_578,"sx",&local_579);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
               &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
               (PLYReceiver *)in_stack_ffffffffffffeea0);
    std::__cxx11::string::~string(local_578);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5a0,"vertex",&local_5a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c8,"sy",&local_5c9);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
               &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
               (PLYReceiver *)in_stack_ffffffffffffeea0);
    std::__cxx11::string::~string(local_5c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
    std::__cxx11::string::~string(local_5a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
    paVar7 = &local_5f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5f0,"vertex",paVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_618,"sz",&local_619);
    PLYReader::setReceiver
              ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
               &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
               (PLYReceiver *)in_stack_ffffffffffffeea0);
    std::__cxx11::string::~string(local_618);
    std::allocator<char>::~allocator((allocator<char> *)&local_619);
    std::__cxx11::string::~string(local_5f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  }
  Mesh::getNormalArray(&in_RDI->super_Mesh);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  Mesh::getNormalArray(&in_RDI->super_Mesh);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  Mesh::getNormalArray(&in_RDI->super_Mesh);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_ffffffffffffeeb0,(float *)in_stack_ffffffffffffeea8,
             (size_t)in_stack_ffffffffffffeea0,
             CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0,"vertex",&local_6a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"nx",&local_6c9);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  std::__cxx11::string::~string(local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f0,"vertex",&local_6f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"ny",&local_719);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::__cxx11::string::~string(local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"vertex",&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_768,"nz",&local_769);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  local_770 = 0x3f800000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_798,"vertex",&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c0,"diffuse_red",&local_7c1);
  pVar3 = PLYReader::getTypeOfProperty
                    ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                     &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  local_774 = pVar3;
  if (pVar3 == ply_none) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7e8,"vertex",&local_7e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_810,"red",&local_811);
    local_774 = PLYReader::getTypeOfProperty
                          ((PLYReader *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                           &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename
                          );
    std::__cxx11::string::~string(local_810);
    std::allocator<char>::~allocator((allocator<char> *)&local_811);
    std::__cxx11::string::~string(local_7e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  }
  if (local_774 == ply_none) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_838,"vertex",&local_839);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_860,"r",&local_861);
    local_774 = PLYReader::getTypeOfProperty
                          ((PLYReader *)
                           CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                           &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename
                          );
    std::__cxx11::string::~string(local_860);
    std::allocator<char>::~allocator((allocator<char> *)&local_861);
    std::__cxx11::string::~string(local_838);
    std::allocator<char>::~allocator((allocator<char> *)&local_839);
  }
  if (local_774 == ply_uint16) {
    local_770 = 0x3b800000;
  }
  if ((local_774 == ply_float32) || (local_774 == ply_float64)) {
    local_770 = 0x437f0000;
  }
  getColorArray(in_RDI);
  UInt8Receiver::UInt8Receiver
            ((UInt8Receiver *)in_stack_ffffffffffffeeb0,(uchar *)in_stack_ffffffffffffeea8,
             (int)((ulong)in_stack_ffffffffffffeea0 >> 0x20),SUB84(in_stack_ffffffffffffeea0,0));
  getColorArray(in_RDI);
  UInt8Receiver::UInt8Receiver
            ((UInt8Receiver *)in_stack_ffffffffffffeeb0,(uchar *)in_stack_ffffffffffffeea8,
             (int)((ulong)in_stack_ffffffffffffeea0 >> 0x20),SUB84(in_stack_ffffffffffffeea0,0));
  getColorArray(in_RDI);
  UInt8Receiver::UInt8Receiver
            ((UInt8Receiver *)in_stack_ffffffffffffeeb0,(uchar *)in_stack_ffffffffffffeea8,
             (int)((ulong)in_stack_ffffffffffffeea0 >> 0x20),SUB84(in_stack_ffffffffffffeea0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e8,"vertex",&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_910,"diffuse_red",&local_911);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::~allocator((allocator<char> *)&local_911);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_938,"vertex",&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_960,"diffuse_green",&local_961);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_960);
  std::allocator<char>::~allocator((allocator<char> *)&local_961);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator((allocator<char> *)&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_988,"vertex",&local_989);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b0,"diffuse_blue",&local_9b1);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_9b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
  std::__cxx11::string::~string(local_988);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9d8,"vertex",&local_9d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a00,"red",&local_a01);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  std::__cxx11::string::~string(local_9d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a28,"vertex",&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a50,"green",&local_a51);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_a51);
  std::__cxx11::string::~string(local_a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a78,"vertex",&local_a79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_aa0,"blue",&local_aa1);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
  std::__cxx11::string::~string(local_a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_a79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac8,"vertex",&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_af0,"r",&local_af1);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b18,"vertex",&local_b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b40,"g",&local_b41);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_b40);
  std::allocator<char>::~allocator((allocator<char> *)&local_b41);
  std::__cxx11::string::~string(local_b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b68,"vertex",&local_b69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b90,"b",&local_b91);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_b90);
  std::allocator<char>::~allocator((allocator<char> *)&local_b91);
  std::__cxx11::string::~string(local_b68);
  std::allocator<char>::~allocator((allocator<char> *)&local_b69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bb8,"face",&local_bb9);
  uVar5 = PLYReader::instancesOfElement
                    (in_stack_ffffffffffffeea8,(string *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
  local_b98 = (int)uVar5;
  (*(in_RDI->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])(in_RDI,uVar5 & 0xffffffff);
  TriangleReceiver::TriangleReceiver
            ((TriangleReceiver *)in_stack_ffffffffffffeea0,
             (Mesh *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf0,"face",&local_bf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c18,"vertex_index",&local_c19);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_c19);
  std::__cxx11::string::~string(local_bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c40,"face",&local_c41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c68,"vertex_indices",&local_c69);
  PLYReader::setReceiver
            ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
             &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename,
             (PLYReceiver *)in_stack_ffffffffffffeea0);
  std::__cxx11::string::~string(local_c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_c69);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  PLYReader::readData(in_stack_ffffffffffffeeb0);
  this_00 = (Mesh *)local_c91;
  std::allocator<char>::allocator();
  local_ce2 = 0;
  local_ce3 = 0;
  local_d0a = 0;
  local_d0b = 0;
  local_d32 = 0;
  local_d33 = 0;
  bVar1 = false;
  bVar2 = false;
  std::__cxx11::string::string((string *)(local_c91 + 1),"vertex",(allocator *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cb8,"nx",&local_cb9);
  pVar3 = PLYReader::getTypeOfProperty
                    ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                     &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename);
  local_1125 = true;
  if (pVar3 != ply_none) {
    std::allocator<char>::allocator();
    local_ce2 = 1;
    std::__cxx11::string::string(local_ce0,"vertex",&local_ce1);
    local_ce3 = 1;
    std::allocator<char>::allocator();
    local_d0a = 1;
    std::__cxx11::string::string(local_d08,"ny",&local_d09);
    local_d0b = 1;
    pVar3 = PLYReader::getTypeOfProperty
                      ((PLYReader *)CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                       &in_stack_ffffffffffffeeb0->filename,&in_stack_ffffffffffffeea8->filename);
    local_1125 = true;
    if (pVar3 != ply_none) {
      paVar7 = &local_d31;
      std::allocator<char>::allocator();
      local_d32 = 1;
      std::__cxx11::string::string(local_d30,"vertex",paVar7);
      local_d33 = 1;
      in_stack_ffffffffffffeea0 = (Mesh *)local_d59;
      std::allocator<char>::allocator();
      bVar1 = true;
      std::__cxx11::string::string
                ((string *)(local_d59 + 1),"nz",(allocator *)in_stack_ffffffffffffeea0);
      bVar2 = true;
      pVar3 = PLYReader::getTypeOfProperty
                        ((PLYReader *)CONCAT44(pVar3,in_stack_ffffffffffffeeb8),(string *)paVar7,
                         local_10);
      local_1125 = pVar3 == ply_none;
    }
  }
  uVar6 = (uint)local_1125 << 0x18;
  if (bVar2) {
    std::__cxx11::string::~string((string *)(local_d59 + 1));
  }
  if (bVar1) {
    std::allocator<char>::~allocator((allocator<char> *)local_d59);
  }
  if ((local_d33 & 1) != 0) {
    std::__cxx11::string::~string(local_d30);
  }
  if ((local_d32 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  }
  if ((local_d0b & 1) != 0) {
    std::__cxx11::string::~string(local_d08);
  }
  if ((local_d0a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  }
  if ((local_ce3 & 1) != 0) {
    std::__cxx11::string::~string(local_ce0);
  }
  if ((local_ce2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
  }
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  std::__cxx11::string::~string((string *)(local_c91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c91);
  if ((uVar6 & 0x1000000) == 0) {
    Mesh::normalizeNormals(in_stack_ffffffffffffeea0);
  }
  else {
    Mesh::recalculateNormals(this_00);
  }
  return;
}

Assistant:

void ColoredMesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  float scale=1.0f;
  ply_type type=ply.getTypeOfProperty("vertex", "diffuse_red");

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "red");
  }

  if (type == ply_none)
  {
    type=ply.getTypeOfProperty("vertex", "r");
  }

  if (type == ply_uint16)
  {
    scale=1.0f/256;
  }

  if (type == ply_float32 || type == ply_float64)
  {
    scale=255;
  }

  UInt8Receiver cr(getColorArray(), 0, scale), cg(getColorArray(), 1, scale), cb(getColorArray(), 2,
      scale);

  ply.setReceiver("vertex", "diffuse_red", &cr);
  ply.setReceiver("vertex", "diffuse_green", &cg);
  ply.setReceiver("vertex", "diffuse_blue", &cb);

  ply.setReceiver("vertex", "red", &cr);
  ply.setReceiver("vertex", "green", &cg);
  ply.setReceiver("vertex", "blue", &cb);

  ply.setReceiver("vertex", "r", &cr);
  ply.setReceiver("vertex", "g", &cg);
  ply.setReceiver("vertex", "b", &cb);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}